

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildOneof
          (DescriptorBuilder *this,OneofDescriptorProto *proto,Descriptor *parent,
          OneofDescriptor *result)

{
  Tables *pTVar1;
  Symbol symbol;
  OneofDescriptor *parent_00;
  Descriptor *proto_00;
  bool bVar2;
  string *psVar3;
  OneofOptions *orig_options;
  string *name;
  Symbol local_40;
  string *local_30;
  string *full_name;
  OneofDescriptor *result_local;
  Descriptor *parent_local;
  OneofDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  pTVar1 = this->tables_;
  full_name = (string *)result;
  result_local = (OneofDescriptor *)parent;
  parent_local = (Descriptor *)proto;
  proto_local = (OneofDescriptorProto *)this;
  psVar3 = Descriptor::full_name_abi_cxx11_(parent);
  local_30 = DescriptorPool::Tables::AllocateString(pTVar1,psVar3);
  std::__cxx11::string::append((ulong)local_30,'\x01');
  psVar3 = local_30;
  OneofDescriptorProto::name_abi_cxx11_((OneofDescriptorProto *)parent_local);
  std::__cxx11::string::append((string *)psVar3);
  psVar3 = OneofDescriptorProto::name_abi_cxx11_((OneofDescriptorProto *)parent_local);
  ValidateSymbolName(this,psVar3,local_30,(Message *)parent_local);
  pTVar1 = this->tables_;
  psVar3 = OneofDescriptorProto::name_abi_cxx11_((OneofDescriptorProto *)parent_local);
  psVar3 = DescriptorPool::Tables::AllocateString(pTVar1,psVar3);
  *(string **)full_name = psVar3;
  full_name->_M_string_length = (size_type)local_30;
  (full_name->field_2)._M_allocated_capacity = (size_type)result_local;
  *(undefined4 *)((long)&full_name->field_2 + 0xc) = 0;
  *(undefined8 *)(full_name + 1) = 0;
  bVar2 = OneofDescriptorProto::has_options((OneofDescriptorProto *)parent_local);
  if (bVar2) {
    orig_options = OneofDescriptorProto::options((OneofDescriptorProto *)parent_local);
    AllocateOptions<google::protobuf::OneofDescriptor>
              (this,orig_options,(OneofDescriptor *)full_name);
  }
  else {
    full_name[1]._M_string_length = 0;
  }
  psVar3 = OneofDescriptor::full_name_abi_cxx11_((OneofDescriptor *)full_name);
  parent_00 = result_local;
  name = OneofDescriptor::name_abi_cxx11_((OneofDescriptor *)full_name);
  proto_00 = parent_local;
  Symbol::Symbol(&local_40,(OneofDescriptor *)full_name);
  symbol.field_1.descriptor = local_40.field_1.descriptor;
  symbol.type = local_40.type;
  symbol._4_4_ = local_40._4_4_;
  AddSymbol(this,psVar3,parent_00,name,(Message *)proto_00,symbol);
  return;
}

Assistant:

void DescriptorBuilder::BuildOneof(const OneofDescriptorProto& proto,
                                   Descriptor* parent,
                                   OneofDescriptor* result) {
  string* full_name = tables_->AllocateString(parent->full_name());
  full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_ = tables_->AllocateString(proto.name());
  result->full_name_ = full_name;

  result->containing_type_ = parent;

  // We need to fill these in later.
  result->field_count_ = 0;
  result->fields_ = NULL;

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));
}